

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::makeSequenceGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,TypeDepth type,
          TypeOneDRule rule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  invalid_argument *piVar2;
  size_type sVar3;
  TypeOneDRule rule_00;
  int local_ec;
  pointer local_b8;
  pointer local_b0;
  unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> local_a8;
  size_type local_a0;
  size_t expected_aw_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string message;
  TypeOneDRule local_24;
  TypeDepth local_20;
  TypeOneDRule rule_local;
  TypeDepth type_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  TasmanianSparseGrid *this_local;
  
  local_24 = rule;
  local_20 = type;
  rule_local = depth;
  type_local = outputs;
  depth_local = dimensions;
  _outputs_local = this;
  if (dimensions < 1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeSequenceGrid() requires positive dimensions");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (outputs < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeSequenceGrid() requires non-negative outputs");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (depth < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeSequenceGrid() requires non-negative depth");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = OneDimensionalMeta::isSequence(rule);
  if (!bVar1) {
    IO::getRuleString_abi_cxx11_((string *)&expected_aw_size,(IO *)(ulong)local_24,rule_00);
    ::std::operator+(&local_78,"ERROR: makeSequenceGrid() is called with rule: ",
                     (string *)&expected_aw_size);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78,", which is not a sequence rule");
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&expected_aw_size);
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(piVar2,(string *)local_58);
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = OneDimensionalMeta::isTypeCurved(local_20);
  if (bVar1) {
    local_ec = depth_local << 1;
  }
  else {
    local_ec = depth_local;
  }
  local_a0 = (size_type)local_ec;
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(anisotropic_weights);
  if (!bVar1) {
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size(anisotropic_weights);
    if (sVar3 != local_a0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar2,
                 "ERROR: makeSequenceGrid() requires anisotropic_weights with either 0 or dimensions entries"
                );
      __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(level_limits);
  if (!bVar1) {
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size(level_limits);
    if (sVar3 != (long)depth_local) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar2,
                 "ERROR: makeSequenceGrid() requires level_limits with either 0 or dimensions entries"
                );
      __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  clear(this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
  if (type_local == type_none) {
    local_b0 = ::std::
               unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
               ::get(&this->acceleration);
    Utils::
    make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext*,int&,int&,TasGrid::TypeDepth&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>&>
              ((Utils *)&local_a8,&local_b0,&depth_local,(int *)&rule_local,&local_20,&local_24,
               anisotropic_weights,&this->llimits);
  }
  else {
    local_b8 = ::std::
               unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
               ::get(&this->acceleration);
    Utils::
    make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext*,int&,int&,int&,TasGrid::TypeDepth&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>&>
              ((Utils *)&local_a8,&local_b8,&depth_local,(int *)&type_local,(int *)&rule_local,
               &local_20,&local_24,anisotropic_weights,&this->llimits);
  }
  ::std::unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>::
  operator=((unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>
             *)&this->base,&local_a8);
  ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::~unique_ptr
            (&local_a8);
  return;
}

Assistant:

void TasmanianSparseGrid::makeSequenceGrid(int dimensions, int outputs, int depth, TypeDepth type, TypeOneDRule rule, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeSequenceGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeSequenceGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeSequenceGrid() requires non-negative depth");
    if (!OneDimensionalMeta::isSequence(rule)){
        std::string message = "ERROR: makeSequenceGrid() is called with rule: " + IO::getRuleString(rule) + ", which is not a sequence rule";
        throw std::invalid_argument(message);
    }
    size_t expected_aw_size = (OneDimensionalMeta::isTypeCurved(type)) ? 2*dimensions : dimensions;
    if ((!anisotropic_weights.empty()) && (anisotropic_weights.size() != expected_aw_size)) throw std::invalid_argument("ERROR: makeSequenceGrid() requires anisotropic_weights with either 0 or dimensions entries");
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeSequenceGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = (outputs == 0) ? Utils::make_unique<GridSequence>(acceleration.get(), dimensions, depth, type, rule, anisotropic_weights, llimits) :
                            Utils::make_unique<GridSequence>(acceleration.get(), dimensions, outputs, depth, type, rule, anisotropic_weights, llimits);
}